

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

apx_error_t
state_parse_data_signature
          (apx_parse_state_t *self,apx_signatureParser_t *parser,uint8_t *begin,uint8_t *end)

{
  uint8_t *puVar1;
  apx_dataElement_t *paVar2;
  uint8_t *result;
  uint8_t *end_local;
  uint8_t *begin_local;
  apx_signatureParser_t *parser_local;
  apx_parse_state_t *self_local;
  
  puVar1 = apx_signatureParser_parse_data_signature(parser,begin,end);
  if (begin < puVar1) {
    if (puVar1 == end) {
      paVar2 = apx_signatureParser_take_data_element(parser);
      self->data_element = paVar2;
      if (self->data_element == (apx_dataElement_t *)0x0) {
        __assert_fail("self->data_element != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/parser.c"
                      ,0x120,
                      "apx_error_t state_parse_data_signature(apx_parse_state_t *, apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                     );
      }
      self_local._4_4_ = 0;
    }
    else {
      self_local._4_4_ = 0x3f;
    }
  }
  else {
    self_local._4_4_ = apx_signatureParser_get_last_error(parser,(uint8_t **)0x0);
  }
  return self_local._4_4_;
}

Assistant:

static apx_error_t state_parse_data_signature(apx_parse_state_t* self, apx_signatureParser_t *parser, uint8_t const* begin, uint8_t const* end)
{
   uint8_t const* result = apx_signatureParser_parse_data_signature(parser, begin, end);
   if (result > begin)
   {
      if (result == end)
      {
         self->data_element = apx_signatureParser_take_data_element(parser);
         assert(self->data_element != NULL);
      }
      else
      {
         return APX_STRAY_CHARACTERS_AFTER_PARSE_ERROR;
      }
      return APX_NO_ERROR;
   }
   return apx_signatureParser_get_last_error(parser, NULL);
}